

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O2

double mae(double *predicted,double *actual,int N)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  dVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar3 = dVar3 + ABS(actual[uVar1] - predicted[uVar1]);
  }
  return dVar3 / (double)N;
}

Assistant:

double mae(double *predicted, double *actual, int N) {
    double err,temp,t;
    int i;

    temp = 0.0;

    for(i = 0; i < N;++i) {
        t = fabs(actual[i] - predicted[i]);
        temp += t;
    }

    err = temp / N;

    return err;
}